

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

shared_ptr<Scene> __thiscall
Scene::Create(Scene *this,shared_ptr<myvk::Queue> *graphics_queue,char *filename,
             atomic<const_char_*> *notification_ptr)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  source_loc loc;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  size_t sVar6;
  char *pcVar7;
  logger *plVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  Scene *this_02;
  shared_ptr<Scene> sVar10;
  string base_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  texture_filenames;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> meshes;
  undefined1 local_c8 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  VkSampler local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> local_68;
  char *local_48;
  basic_string_view<char> local_40;
  
  local_48 = filename;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xa0);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_003299c0;
  this_02 = (Scene *)(this_01 + 1);
  memset(this_02,0,0x90);
  sVar6 = strlen(filename);
  local_a8._M_pi = &local_98;
  if (sVar6 == 0) {
    local_a0 = (VkSampler)0x0;
    local_98._vptr__Sp_counted_base._0_1_ = 0;
  }
  else {
    pcVar7 = filename + sVar6;
    do {
      if ((pcVar7[-1] == '/') || (pcVar7[-1] == '\\')) break;
      bVar4 = filename < pcVar7;
      pcVar7 = pcVar7 + -1;
    } while (bVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,filename);
  }
  local_68.super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (notification_ptr != (atomic<const_char_*> *)0x0) {
    LOCK();
    (notification_ptr->_M_b)._M_p = "Loading Mesh";
    UNLOCK();
  }
  bVar4 = load_meshes(filename,(char *)local_a8._M_pi,&local_68,&local_88);
  if (bVar4) {
    plVar8 = spdlog::default_logger_raw();
    local_c8._0_8_ = (_func_int **)0x0;
    local_c8._8_8_ = (element_type *)0x0;
    local_c8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40.data_ = "Meshes loaded from {}";
    local_40.size_ = 0x15;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    spdlog::logger::log_<fmt::v7::basic_string_view<char>,char_const*&>
              (plVar8,loc,info,&local_40,&local_48);
    if (notification_ptr != (atomic<const_char_*> *)0x0) {
      LOCK();
      (notification_ptr->_M_b)._M_p = "Optimizing Mesh and Creating Buffers";
      UNLOCK();
    }
    load_buffers_and_draw_cmd(this_02,graphics_queue,&local_68);
    if (notification_ptr != (atomic<const_char_*> *)0x0) {
      LOCK();
      (notification_ptr->_M_b)._M_p = "Loading Textures";
      UNLOCK();
    }
    iVar5 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    myvk::Sampler::Create
              ((Sampler *)local_c8,(Ptr<Device> *)CONCAT44(extraout_var,iVar5),VK_FILTER_LINEAR,
               VK_SAMPLER_ADDRESS_MODE_REPEAT,VK_SAMPLER_MIPMAP_MODE_LINEAR,1000.0,false,1.0);
    uVar2 = local_c8._8_8_;
    uVar1 = local_c8._0_8_;
    local_c8._0_8_ = (_func_int **)0x0;
    local_c8._8_8_ = (element_type *)0x0;
    uVar3 = local_c8._8_8_;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this_01[1]._M_use_count;
    this_01[1]._vptr__Sp_counted_base = (_func_int **)uVar1;
    local_c8._8_4_ = (undefined4)uVar2;
    local_c8._12_4_ = SUB84(uVar2,4);
    this_01[1]._M_use_count = local_c8._8_4_;
    this_01[1]._M_weak_count = local_c8._12_4_;
    local_c8._8_8_ = uVar3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
    }
    load_textures(this_02,graphics_queue,&local_88);
    process_texture_errors(this_02);
    iVar5 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    create_descriptors(this_02,(shared_ptr<myvk::Device> *)CONCAT44(extraout_var_00,iVar5));
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_02;
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = this_01;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    plVar8 = spdlog::default_logger_raw();
    local_c8._0_8_ = (_func_int **)0x0;
    local_c8._8_8_ = (element_type *)0x0;
    local_c8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    spdlog::logger::log(plVar8,0.0);
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::~vector(&local_68);
  _Var9._M_pi = extraout_RDX;
  if (local_a8._M_pi != &local_98) {
    operator_delete(local_a8._M_pi,
                    CONCAT71(local_98._vptr__Sp_counted_base._1_7_,
                             local_98._vptr__Sp_counted_base._0_1_) + 1);
    _Var9._M_pi = extraout_RDX_00;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    _Var9._M_pi = extraout_RDX_01;
  }
  sVar10.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var9._M_pi;
  sVar10.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Scene>)sVar10.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Scene> Scene::Create(const std::shared_ptr<myvk::Queue> &graphics_queue, const char *filename,
                                     std::atomic<const char *> *notification_ptr) {
	std::shared_ptr<Scene> ret = std::make_shared<Scene>();

	std::string base_dir = get_base_dir(filename);

	std::vector<Mesh> meshes;
	std::vector<std::string> texture_filenames;

	if (notification_ptr)
		notification_ptr->store("Loading Mesh");
	if (!load_meshes(filename, base_dir.c_str(), &meshes, &texture_filenames)) {
		spdlog::error("Failed to load meshes");
		return nullptr;
	}
	spdlog::info("Meshes loaded from {}", filename);

	if (notification_ptr)
		notification_ptr->store("Optimizing Mesh and Creating Buffers");
	ret->load_buffers_and_draw_cmd(graphics_queue, meshes);
	if (notification_ptr)
		notification_ptr->store("Loading Textures");
	ret->m_sampler =
	    myvk::Sampler::Create(graphics_queue->GetDevicePtr(), VK_FILTER_LINEAR, VK_SAMPLER_ADDRESS_MODE_REPEAT,
	                          VK_SAMPLER_MIPMAP_MODE_LINEAR, VK_LOD_CLAMP_NONE);
	ret->load_textures(graphics_queue, texture_filenames);
	ret->process_texture_errors();
	ret->create_descriptors(graphics_queue->GetDevicePtr());

	return ret;
}